

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void absl::synchronization_internal::BackwardDFS(Rep *r,int32_t n,int32_t lower_bound)

{
  bool bVar1;
  uint32_t *puVar2;
  Node **ppNVar3;
  Node *nw;
  int32_t _cursor;
  int32_t w;
  Node *nn;
  int32_t lower_bound_local;
  int32_t n_local;
  Rep *r_local;
  
  nn._0_4_ = lower_bound;
  nn._4_4_ = n;
  _lower_bound_local = r;
  anon_unknown_0::Vec<int>::clear(&r->deltab_);
  anon_unknown_0::Vec<int>::clear(&_lower_bound_local->stack_);
  anon_unknown_0::Vec<int>::push_back(&_lower_bound_local->stack_,(int *)((long)&nn + 4));
  while (bVar1 = anon_unknown_0::Vec<int>::empty(&_lower_bound_local->stack_),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = (uint32_t *)anon_unknown_0::Vec<int>::back(&_lower_bound_local->stack_);
    nn._4_4_ = *puVar2;
    anon_unknown_0::Vec<int>::pop_back(&_lower_bound_local->stack_);
    ppNVar3 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[](&_lower_bound_local->nodes_,nn._4_4_);
    __cursor = *ppNVar3;
    if ((__cursor->visited & 1U) == 0) {
      __cursor->visited = true;
      anon_unknown_0::Vec<int>::push_back(&_lower_bound_local->deltab_,(int *)((long)&nn + 4));
      nw._0_4_ = 0;
      while (bVar1 = anon_unknown_0::NodeSet::Next
                               (&__cursor->in,(int32_t *)&nw,(int32_t *)((long)&nw + 4)), bVar1) {
        ppNVar3 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>
                  ::operator[](&_lower_bound_local->nodes_,nw._4_4_);
        if ((((*ppNVar3)->visited & 1U) == 0) && ((int32_t)nn < (*ppNVar3)->rank)) {
          anon_unknown_0::Vec<int>::push_back(&_lower_bound_local->stack_,(int *)((long)&nw + 4));
        }
      }
    }
  }
  return;
}

Assistant:

static void BackwardDFS(GraphCycles::Rep* r, int32_t n, int32_t lower_bound) {
  r->deltab_.clear();
  r->stack_.clear();
  r->stack_.push_back(n);
  while (!r->stack_.empty()) {
    n = r->stack_.back();
    r->stack_.pop_back();
    Node* nn = r->nodes_[n];
    if (nn->visited) continue;

    nn->visited = true;
    r->deltab_.push_back(n);

    HASH_FOR_EACH(w, nn->in) {
      Node* nw = r->nodes_[w];
      if (!nw->visited && lower_bound < nw->rank) {
        r->stack_.push_back(w);
      }
    }
  }
}